

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O2

StructElement * __thiscall
soul::HEARTGenerator::createStructSubElement
          (HEARTGenerator *this,StructMemberRef *member,Expression *source)

{
  StructElement *pSVar1;
  string sStack_38;
  
  std::__cxx11::string::string((string *)&sStack_38,(string *)&member->memberName);
  pSVar1 = BlockBuilder::createStructElement(&(this->builder).super_BlockBuilder,source,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  return pSVar1;
}

Assistant:

heart::StructElement& createStructSubElement (AST::StructMemberRef& member, heart::Expression& source)
    {
        return builder.createStructElement (source, member.memberName);
    }